

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O0

CURLcode deflate_init_writer(connectdata *conn,contenc_writer *writer)

{
  int iVar1;
  z_stream *z;
  zlib_params *zp;
  contenc_writer *writer_local;
  connectdata *conn_local;
  
  if (writer->downstream == (contenc_writer *)0x0) {
    conn_local._4_4_ = CURLE_WRITE_ERROR;
  }
  else {
    writer[3].params = zalloc_cb;
    writer[4].handler = (content_encoding *)zfree_cb;
    iVar1 = inflateInit_((z_stream *)(writer + 1),"1.2.11",0x70);
    if (iVar1 == 0) {
      *(undefined4 *)&writer->params = 1;
      conn_local._4_4_ = CURLE_OK;
    }
    else {
      conn_local._4_4_ = process_zlib_error(conn,(z_stream *)(writer + 1));
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode deflate_init_writer(struct connectdata *conn,
                                    contenc_writer *writer)
{
  zlib_params *zp = (zlib_params *) &writer->params;
  z_stream *z = &zp->z;     /* zlib state structure */

  if(!writer->downstream)
    return CURLE_WRITE_ERROR;

  /* Initialize zlib */
  z->zalloc = (alloc_func) zalloc_cb;
  z->zfree = (free_func) zfree_cb;

  if(inflateInit(z) != Z_OK)
    return process_zlib_error(conn, z);
  zp->zlib_init = ZLIB_INIT;
  return CURLE_OK;
}